

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O3

int anon_unknown.dwarf_124fc::RtMidiIn_getmessage(lua_State *L)

{
  pointer puVar1;
  pointer puVar2;
  RtMidiIn *pRVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidiin");
  pRVar3 = luaGetUserdata<RtMidiIn>(L,1,"RtMidiIn");
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar6 = MidiInApi::getMessage((MidiInApi *)(pRVar3->super_RtMidi).rtapi_,&local_38);
  puVar2 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((dVar6 != 0.0) || (NAN(dVar6))) ||
     (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    lua_pushnumber(L);
    lua_createtable(L,(long)puVar2 - (long)puVar1 & 0xffffffff,0);
    uVar5 = 0;
    while ((long)puVar2 - (long)puVar1 != uVar5) {
      lua_pushinteger(L,local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar5]);
      uVar5 = uVar5 + 1;
      lua_rawseti(L,0xfffffffe,uVar5 & 0xffffffff);
    }
    iVar4 = 2;
  }
  else {
    iVar4 = 0;
  }
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int RtMidiIn_getmessage(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	auto msg = std::vector<unsigned char> { };
	double dt = self.getMessage(&msg);
	if (dt == 0.0 && msg.empty())
		return 0;

	auto n = msg.size();
	lua_pushnumber(L, dt);
	lua_createtable(L, n, 0);
	for (std::size_t i = 0; i < n; ++i) {
		lua_pushinteger(L, msg[i]);
		lua_rawseti(L, -2, i + 1);
	}
	return 2;
}